

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

size_t CalculateBlockSymbolSizeGivenCounts
                 (size_t *ll_counts,size_t *d_counts,uint *ll_lengths,uint *d_lengths,
                 ZopfliLZ77Store *lz77,size_t lstart,size_t lend)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  
  if (lend < lstart + 0x360) {
    sVar1 = CalculateBlockSymbolSizeSmall(ll_lengths,d_lengths,lz77,lstart,lend);
    return sVar1;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    lVar2 = lVar2 + (ulong)ll_lengths[lVar3] * ll_counts[lVar3];
  }
  for (lVar3 = 0; lVar3 != 0x74; lVar3 = lVar3 + 4) {
    lVar2 = lVar2 + ((long)*(int *)((long)&ZopfliGetLengthSymbolExtraBits_table + lVar3) +
                    (ulong)*(uint *)((long)ll_lengths + lVar3 + 0x404)) *
                    *(long *)((long)ll_counts + lVar3 * 2 + 0x808);
  }
  for (lVar3 = 0; lVar3 != 0x78; lVar3 = lVar3 + 4) {
    lVar2 = lVar2 + ((long)*(int *)((long)&ZopfliGetDistSymbolExtraBits_table + lVar3) +
                    (ulong)*(uint *)((long)d_lengths + lVar3)) *
                    *(long *)((long)d_counts + lVar3 * 2);
  }
  return lVar2 + (ulong)ll_lengths[0x100];
}

Assistant:

static size_t CalculateBlockSymbolSizeGivenCounts(const size_t* ll_counts,
                                                  const size_t* d_counts,
                                                  const unsigned* ll_lengths,
                                                  const unsigned* d_lengths,
                                                  const ZopfliLZ77Store* lz77,
                                                  size_t lstart, size_t lend) {
  size_t result = 0;
  size_t i;
  if (lstart + ZOPFLI_NUM_LL * 3 > lend) {
    return CalculateBlockSymbolSizeSmall(
        ll_lengths, d_lengths, lz77, lstart, lend);
  } else {
    for (i = 0; i < 256; i++) {
      result += ll_lengths[i] * ll_counts[i];
    }
    for (i = 257; i < 286; i++) {
      result += ll_lengths[i] * ll_counts[i];
      result += ZopfliGetLengthSymbolExtraBits(i) * ll_counts[i];
    }
    for (i = 0; i < 30; i++) {
      result += d_lengths[i] * d_counts[i];
      result += ZopfliGetDistSymbolExtraBits(i) * d_counts[i];
    }
    result += ll_lengths[256]; /*end symbol*/
    return result;
  }
}